

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx11.cc
# Opt level: O2

void do_variadic(void)

{
  bool bVar1;
  allocator<char> local_52;
  allocator<char> local_51;
  int local_50;
  int local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  variadic<int,int>(0,0x11b1b5);
  variadic<int>(0);
  local_50 = 5;
  local_4c = local_50;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"a",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"a",&local_52);
  bVar1 = pairwise_equal<int,double,double,std::__cxx11::string,std::__cxx11::string>
                    (&local_4c,&local_50,2.0,2.0,&local_28,&local_48);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
    return;
  }
  __assert_fail("pairwise_equal(5, 5, 2.0, 2.0, std::string(\"a\"), std::string(\"a\"))",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/cxx11.cc",
                0xb0,"void do_variadic()");
}

Assistant:

void
do_variadic()
{
    variadic(15, 15);
    variadic(12);
    assert(pairwise_equal(5, 5, 2.0, 2.0, std::string("a"), std::string("a")));
    assert(!pairwise_equal(5, 5, 2.0, 3.0));
}